

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O2

void cjson_set_number_value_should_set_numbers(void)

{
  UnityAssertEqualNumber(1,1,0,0xcd,0x14);
  UnityAssertDoublesWithin(0x3d7a636641c4df1a,0x3ff8000000000000,0,0,0xce);
  UnityAssertEqualNumber(0xffffffffffffffff,0xffffffffffffffff,0,0xd1,0x14);
  UnityAssertDoublesWithin(0xbd7a636641c4df1a,0xbff8000000000000,0,0,0xd2);
  UnityAssertEqualNumber(0x7fffffff,0x7fffffff,0,0xd5,0x14);
  UnityAssertDoublesWithin(0x3f619799812dea11,0x41e0000000000000,0,0,0xd6);
  UnityAssertEqualNumber(0xffffffff80000000,0xffffffff80000000,0,0xd9,0x14);
  UnityAssertDoublesWithin(0xbf61979981511944,0xc1e0000000200000,0x200000,0,0xda);
  return;
}

Assistant:

static void cjson_set_number_value_should_set_numbers(void)
{
    cJSON number[1] = {{NULL, NULL, NULL, cJSON_Number, NULL, 0, 0, NULL}};

    cJSON_SetNumberValue(number, 1.5);
    TEST_ASSERT_EQUAL(1, number->valueint);
    TEST_ASSERT_EQUAL_DOUBLE(1.5, number->valuedouble);

    cJSON_SetNumberValue(number, -1.5);
    TEST_ASSERT_EQUAL(-1, number->valueint);
    TEST_ASSERT_EQUAL_DOUBLE(-1.5, number->valuedouble);

    cJSON_SetNumberValue(number, 1 + (double)INT_MAX);
    TEST_ASSERT_EQUAL(INT_MAX, number->valueint);
    TEST_ASSERT_EQUAL_DOUBLE(1 + (double)INT_MAX, number->valuedouble);

    cJSON_SetNumberValue(number, -1 + (double)INT_MIN);
    TEST_ASSERT_EQUAL(INT_MIN, number->valueint);
    TEST_ASSERT_EQUAL_DOUBLE(-1 + (double)INT_MIN, number->valuedouble);
}